

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

void __thiscall
cmGeneratorTarget::ComputeVersionedName
          (cmGeneratorTarget *this,string *vName,string *prefix,string *base,string *suffix,
          string *name,char *version)

{
  cmMakefile *pcVar1;
  bool bVar2;
  allocator<char> local_d1;
  string local_d0;
  string local_b0 [55];
  allocator<char> local_79;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string *local_38;
  string *name_local;
  string *suffix_local;
  string *base_local;
  string *prefix_local;
  string *vName_local;
  cmGeneratorTarget *this_local;
  
  pcVar1 = this->Makefile;
  local_38 = name;
  name_local = suffix;
  suffix_local = base;
  base_local = prefix;
  prefix_local = vName;
  vName_local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"APPLE",&local_79);
  bVar2 = cmMakefile::IsOn(pcVar1,&local_78);
  if (bVar2) {
    std::operator+(&local_58,base_local,suffix_local);
  }
  else {
    std::__cxx11::string::string((string *)&local_58,(string *)local_38);
  }
  std::__cxx11::string::operator=((string *)prefix_local,(string *)&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  if (version != (char *)0x0) {
    std::__cxx11::string::operator+=((string *)prefix_local,".");
    std::__cxx11::string::operator+=((string *)prefix_local,version);
  }
  pcVar1 = this->Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"APPLE",&local_d1);
  bVar2 = cmMakefile::IsOn(pcVar1,&local_d0);
  if (bVar2) {
    std::__cxx11::string::string(local_b0,(string *)name_local);
  }
  else {
    std::__cxx11::string::string(local_b0);
  }
  std::__cxx11::string::operator+=((string *)prefix_local,local_b0);
  std::__cxx11::string::~string(local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator(&local_d1);
  return;
}

Assistant:

void cmGeneratorTarget::ComputeVersionedName(std::string& vName,
                                             std::string const& prefix,
                                             std::string const& base,
                                             std::string const& suffix,
                                             std::string const& name,
                                             const char* version) const
{
  vName = this->Makefile->IsOn("APPLE") ? (prefix + base) : name;
  if (version) {
    vName += ".";
    vName += version;
  }
  vName += this->Makefile->IsOn("APPLE") ? suffix : std::string();
}